

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void createFallbackEdge(_GLFWwindow *window,_GLFWfallbackEdgeWayland *edge,wl_surface *parent,
                       wl_buffer *buffer,int x,int y,int width,int height)

{
  wl_surface *pwVar1;
  wl_compositor *pwVar2;
  wl_subcompositor *pwVar3;
  wp_viewporter *pwVar4;
  PFN_wl_proxy_marshal_flags UNRECOVERED_JUMPTABLE;
  uint32_t uVar5;
  wl_proxy *pwVar6;
  wl_proxy *pwVar7;
  undefined4 in_register_0000008c;
  
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar2 = _glfw.wl.compositor;
  uVar5 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.compositor);
  pwVar6 = (*UNRECOVERED_JUMPTABLE)((wl_proxy *)pwVar2,0,&_glfw_wl_surface_interface,uVar5,0,0);
  edge->surface = (wl_surface *)pwVar6;
  (*_glfw.wl.client.proxy_set_user_data)(pwVar6,window);
  (*_glfw.wl.client.proxy_set_tag)((wl_proxy *)edge->surface,&_glfw.wl.tag);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar3 = _glfw.wl.subcompositor;
  pwVar1 = edge->surface;
  uVar5 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.subcompositor);
  pwVar6 = (*UNRECOVERED_JUMPTABLE)
                     ((wl_proxy *)pwVar3,1,&_glfw_wl_subsurface_interface,uVar5,0,0,pwVar1,parent);
  edge->subsurface = (wl_subsurface *)pwVar6;
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar6);
  (*UNRECOVERED_JUMPTABLE)
            (pwVar6,1,(wl_interface *)0x0,uVar5,0,(ulong)(uint)x,CONCAT44(in_register_0000008c,y));
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar4 = _glfw.wl.viewporter;
  pwVar1 = edge->surface;
  uVar5 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.viewporter);
  pwVar6 = (*UNRECOVERED_JUMPTABLE)
                     ((wl_proxy *)pwVar4,1,&_glfw_wp_viewport_interface,uVar5,0,0,pwVar1);
  edge->viewport = (wp_viewport *)pwVar6;
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar6);
  (*UNRECOVERED_JUMPTABLE)
            (pwVar6,2,(wl_interface *)0x0,uVar5,0,(ulong)(uint)width,(ulong)(uint)height);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar6 = (wl_proxy *)edge->surface;
  uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar6);
  (*UNRECOVERED_JUMPTABLE)(pwVar6,1,(wl_interface *)0x0,uVar5,0,buffer,0,0);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar2 = _glfw.wl.compositor;
  uVar5 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.compositor);
  pwVar7 = (*UNRECOVERED_JUMPTABLE)((wl_proxy *)pwVar2,1,&_glfw_wl_region_interface,uVar5,0,0);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar7);
  (*UNRECOVERED_JUMPTABLE)
            (pwVar7,1,(wl_interface *)0x0,uVar5,0,0,0,(ulong)(uint)width,(ulong)(uint)height);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar6 = (wl_proxy *)edge->surface;
  uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar6);
  (*UNRECOVERED_JUMPTABLE)(pwVar6,4,(wl_interface *)0x0,uVar5,0,pwVar7);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar6 = (wl_proxy *)edge->surface;
  uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar6);
  (*UNRECOVERED_JUMPTABLE)(pwVar6,6,(wl_interface *)0x0,uVar5,0);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar7);
  (*UNRECOVERED_JUMPTABLE)(pwVar7,0,(wl_interface *)0x0,uVar5,1,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

static void createFallbackEdge(_GLFWwindow* window,
                               _GLFWfallbackEdgeWayland* edge,
                               struct wl_surface* parent,
                               struct wl_buffer* buffer,
                               int x, int y,
                               int width, int height)
{
    edge->surface = wl_compositor_create_surface(_glfw.wl.compositor);
    wl_surface_set_user_data(edge->surface, window);
    wl_proxy_set_tag((struct wl_proxy*) edge->surface, &_glfw.wl.tag);
    edge->subsurface = wl_subcompositor_get_subsurface(_glfw.wl.subcompositor,
                                                       edge->surface, parent);
    wl_subsurface_set_position(edge->subsurface, x, y);
    edge->viewport = wp_viewporter_get_viewport(_glfw.wl.viewporter,
                                                edge->surface);
    wp_viewport_set_destination(edge->viewport, width, height);
    wl_surface_attach(edge->surface, buffer, 0, 0);

    struct wl_region* region = wl_compositor_create_region(_glfw.wl.compositor);
    wl_region_add(region, 0, 0, width, height);
    wl_surface_set_opaque_region(edge->surface, region);
    wl_surface_commit(edge->surface);
    wl_region_destroy(region);
}